

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,ExclusivePublication *publication)

{
  string local_38;
  
  ChannelUri::addSessionId(&local_38,&publication->m_channel,publication->m_sessionId);
  stopRecording(this,&local_38,publication->m_streamId);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AeronArchive::stopRecording(const aeron::ExclusivePublication& publication) {
    const std::string& recordingChannel = ChannelUri::addSessionId(publication.channel(), publication.sessionId());

    stopRecording(recordingChannel, publication.streamId());
}